

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x01'>::update
          (basic_dynamic_counter<long,_(unsigned_char)__x01_> *this,label_key_type labels_value,
          long value)

{
  long lVar1;
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair>,_bool>
  local_28;
  
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)1>::
  try_emplace<std::array<std::__cxx11::string,1ul>const&>
            (&local_28,(dynamic_metric_impl<std::atomic<long>,(unsigned_char)1> *)this,labels_value)
  ;
  LOCK();
  lVar1 = ((local_28.first.
            super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->value).super___atomic_base<long>._M_i;
  ((local_28.first.
    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->value).super___atomic_base<long>._M_i = value;
  UNLOCK();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.first.
              super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return lVar1;
}

Assistant:

value_type update(label_key_type labels_value, value_type value) {
    return Base::try_emplace(labels_value)
        .first->value.exchange(value, std::memory_order::relaxed);
  }